

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatEdge.c
# Opt level: O3

Vec_Int_t * Seg_ManConvertResult(Seg_Man_t *p)

{
  int Entry;
  int Entry_00;
  int iVar1;
  Vec_Int_t *p_00;
  int *piVar2;
  Vec_Int_t *pVVar3;
  int v;
  long lVar4;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 1000;
  p_00->nSize = 0;
  piVar2 = (int *)malloc(4000);
  p_00->pArray = piVar2;
  pVVar3 = p->vEdges;
  if (1 < pVVar3->nSize) {
    lVar4 = 1;
    v = 0;
    do {
      Entry = pVVar3->pArray[lVar4 + -1];
      Entry_00 = pVVar3->pArray[lVar4];
      iVar1 = sat_solver_var_value(p->pSat,v);
      if (iVar1 != 0) {
        Vec_IntPush(p_00,Entry);
        Vec_IntPush(p_00,Entry_00);
      }
      pVVar3 = p->vEdges;
      lVar4 = lVar4 + 2;
      v = v + 1;
    } while ((int)lVar4 < pVVar3->nSize);
  }
  return p_00;
}

Assistant:

Vec_Int_t * Seg_ManConvertResult( Seg_Man_t * p )
{
    int iFanin, iObj, i;
    Vec_Int_t * vEdges2 = Vec_IntAlloc( 1000 );
    Vec_IntForEachEntryDouble( p->vEdges, iFanin, iObj, i )
        if ( sat_solver_var_value(p->pSat, i/2) )
            Vec_IntPushTwo( vEdges2, iFanin, iObj );
    return vEdges2;
}